

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall
el::Configurations::unsafeSet
          (Configurations *this,Level level,ConfigurationType configurationType,string *value)

{
  Configuration *pCVar1;
  Level level_local;
  
  level_local = level;
  pCVar1 = base::utils::RegistryWithPred<el::Configuration,el::Configuration::Predicate>::
           get<el::Level,el::ConfigurationType>
                     ((RegistryWithPred<el::Configuration,el::Configuration::Predicate> *)this,
                      &level_local,configurationType);
  if (pCVar1 == (Configuration *)0x0) {
    pCVar1 = (Configuration *)operator_new(0x30);
    Configuration::Configuration(pCVar1,level_local,configurationType,value);
    (*(this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
      super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      .super_ThreadSafe._vptr_ThreadSafe[0x10])(this,pCVar1);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&pCVar1->m_value);
  }
  if (level_local == Global) {
    unsafeSetGlobally(this,configurationType,value,false);
  }
  return;
}

Assistant:

void Configurations::unsafeSet(Level level, ConfigurationType configurationType, const std::string& value) {
  Configuration* conf = RegistryWithPred<Configuration, Configuration::Predicate>::get(level, configurationType);
  if (conf == nullptr) {
    registerNew(new Configuration(level, configurationType, value));
  } else {
    conf->setValue(value);
  }
  if (level == Level::Global) {
    unsafeSetGlobally(configurationType, value, false);
  }
}